

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O3

void calc<float>(options *opt)

{
  char *pcVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  invalid_argument *this;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> f0;
  float fVar9;
  fvar<float,_2UL> fVar10;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> b0;
  char *local_a8;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [24];
  
  pcVar1 = (opt->Ja)._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar7 = *piVar3;
  *piVar3 = 0;
  fVar8 = strtof(pcVar1,&local_a8);
  if ((char *)CONCAT71(local_a8._1_7_,local_a8._0_1_) == pcVar1) {
    std::__throw_invalid_argument("stof");
LAB_001093c5:
    std::__throw_invalid_argument("stof");
LAB_001093d1:
    std::__throw_invalid_argument("stof");
LAB_001093dd:
    std::__throw_invalid_argument("stof");
LAB_001093e9:
    std::__throw_invalid_argument("stof");
LAB_001093f5:
    std::__throw_invalid_argument("stof");
  }
  else {
    iVar6 = *piVar3;
    local_94 = fVar8;
    if (iVar6 == 0) {
LAB_00108f18:
      *piVar3 = iVar7;
      iVar6 = iVar7;
    }
    else if (iVar6 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00108f18;
    }
    pcVar1 = (opt->Jb)._M_dataplus._M_p;
    *piVar3 = 0;
    fVar8 = strtof(pcVar1,&local_a8);
    if ((char *)CONCAT71(local_a8._1_7_,local_a8._0_1_) == pcVar1) goto LAB_001093c5;
    iVar7 = *piVar3;
    local_98 = fVar8;
    if (iVar7 == 0) {
LAB_00108f60:
      *piVar3 = iVar6;
      iVar7 = iVar6;
    }
    else if (iVar7 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00108f60;
    }
    pcVar1 = (opt->Jc)._M_dataplus._M_p;
    *piVar3 = 0;
    fVar8 = strtof(pcVar1,&local_a8);
    if ((char *)CONCAT71(local_a8._1_7_,local_a8._0_1_) == pcVar1) goto LAB_001093d1;
    iVar6 = *piVar3;
    local_9c = fVar8;
    if (iVar6 == 0) {
LAB_00108fa4:
      *piVar3 = iVar7;
      iVar6 = iVar7;
    }
    else if (iVar6 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00108fa4;
    }
    pcVar1 = (opt->Tmin)._M_dataplus._M_p;
    *piVar3 = 0;
    fVar8 = strtof(pcVar1,&local_a8);
    if ((char *)CONCAT71(local_a8._1_7_,local_a8._0_1_) == pcVar1) goto LAB_001093dd;
    iVar7 = *piVar3;
    local_a0 = fVar8;
    if (iVar7 == 0) {
LAB_00108fec:
      *piVar3 = iVar6;
      iVar7 = iVar6;
    }
    else if (iVar7 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00108fec;
    }
    pcVar1 = (opt->Tmax)._M_dataplus._M_p;
    *piVar3 = 0;
    local_88._0_4_ = strtof(pcVar1,&local_a8);
    if ((char *)CONCAT71(local_a8._1_7_,local_a8._0_1_) == pcVar1) goto LAB_001093e9;
    iVar6 = *piVar3;
    if (iVar6 == 0) {
LAB_00109033:
      *piVar3 = iVar7;
      iVar6 = iVar7;
    }
    else if (iVar6 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00109033;
    }
    pcVar1 = (opt->dT)._M_dataplus._M_p;
    *piVar3 = 0;
    fVar8 = strtof(pcVar1,&local_a8);
    if ((char *)CONCAT71(local_a8._1_7_,local_a8._0_1_) == pcVar1) goto LAB_001093f5;
    fVar9 = local_a0;
    if (*piVar3 == 0) {
LAB_0010907a:
      *piVar3 = iVar6;
    }
    else if (*piVar3 == 0x22) {
      fVar8 = (float)std::__throw_out_of_range("stof");
      goto LAB_0010907a;
    }
    lVar2 = std::cout;
    if (fVar9 <= (float)local_88._0_4_) {
      local_90 = fVar8;
      if (0.0 < fVar8) {
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
             0x100;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 6;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# lattice: triangular\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# precision: ",0xd);
        plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,6);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        poVar5 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n",0x23);
        local_50 = (double)local_90 * 0.0001 + (double)(float)local_88._0_4_;
        local_78 = (double)local_a0;
        if (local_78 < local_50) {
          local_58 = (double)local_94;
          local_60 = (double)local_98;
          local_68 = (double)local_9c;
          do {
            local_88 = ZEXT416((uint)(1.0 / local_a0));
            fVar10.v._M_elems[1] = 1.0;
            fVar10.v._M_elems[0] = 1.0 / local_a0;
            fVar10.v._M_elems[2] = 0.0;
            fVar10 = ising::free_energy::triangular::
                     infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                               (local_94,local_98,local_9c,fVar10);
            local_8c = fVar10.v._M_elems[2];
            local_48._8_4_ = extraout_XMM0_Dc;
            local_48._0_8_ = fVar10.v._M_elems._0_8_;
            local_48._12_4_ = extraout_XMM0_Dd;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inf inf ",8);
            poVar5 = std::ostream::_M_insert<double>(local_58);
            local_a8._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
            poVar5 = std::ostream::_M_insert<double>(local_60);
            local_a8._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
            poVar5 = std::ostream::_M_insert<double>(local_68);
            local_a8._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
            poVar5 = std::ostream::_M_insert<double>(local_78);
            local_a8._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
            poVar5 = std::ostream::_M_insert<double>((double)(float)local_88._0_4_);
            local_a8._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
            poVar5 = std::ostream::_M_insert<double>((double)(float)local_48._0_4_);
            local_a8._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
            local_78 = (double)CONCAT44(local_48._4_4_,local_48._4_4_);
            fStack_70 = (float)local_48._4_4_;
            fStack_6c = (float)local_48._4_4_;
            poVar5 = std::ostream::_M_insert<double>
                               ((double)((float)local_88._0_4_ * (float)local_48._4_4_ +
                                        (float)local_48._0_4_));
            local_a8._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
            poVar5 = std::ostream::_M_insert<double>
                               ((double)(-(float)local_88._0_4_ * (float)local_88._0_4_ *
                                        ((float)local_78 + (float)local_78 +
                                        (local_8c + local_8c) * (float)local_88._0_4_)));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            local_a0 = local_a0 + local_90;
            local_78 = (double)local_a0;
          } while (local_78 < local_50);
        }
        return;
      }
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"dT should be positive");
      goto LAB_0010943b;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
LAB_0010943b:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options &opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Ja = convert<real_t>(opt.Ja);
  real_t Jb = convert<real_t>(opt.Jb);
  real_t Jc = convert<real_t>(opt.Jc);
  real_t Tmin = convert<real_t>(opt.Tmin);
  real_t Tmax = convert<real_t>(opt.Tmax);
  real_t dT = convert<real_t>(opt.dT);
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << "inf inf " << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' '
              << (1 / t) << ' ' << free_energy(f, beta) << ' '
              << energy(f, beta) << ' ' << specific_heat(f, beta) << std::endl;
  }
}